

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O1

void __thiscall
license::FullLicenseInfo::FullLicenseInfo
          (FullLicenseInfo *this,string *source,string *product,string *license_signature,
          int licenseVersion,string *from_date,string *to_date,string *client_signature,
          uint from_sw_version,uint to_sw_version,string *extra_data)

{
  pointer pcVar1;
  int iVar2;
  
  (this->source)._M_dataplus._M_p = (pointer)&(this->source).field_2;
  pcVar1 = (source->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + source->_M_string_length)
  ;
  (this->product)._M_dataplus._M_p = (pointer)&(this->product).field_2;
  pcVar1 = (product->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->product,pcVar1,pcVar1 + product->_M_string_length);
  (this->license_signature)._M_dataplus._M_p = (pointer)&(this->license_signature).field_2;
  pcVar1 = (license_signature->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->license_signature,pcVar1,pcVar1 + license_signature->_M_string_length)
  ;
  this->license_version = licenseVersion;
  (this->from_date)._M_dataplus._M_p = (pointer)&(this->from_date).field_2;
  pcVar1 = (from_date->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->from_date,pcVar1,pcVar1 + from_date->_M_string_length);
  (this->to_date)._M_dataplus._M_p = (pointer)&(this->to_date).field_2;
  pcVar1 = (to_date->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->to_date,pcVar1,pcVar1 + to_date->_M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)to_date);
  this->has_expiry = iVar2 != 0;
  this->from_sw_version = from_sw_version;
  this->to_sw_version = to_sw_version;
  this->has_versions = to_sw_version != 0 || from_sw_version != 0;
  (this->client_signature)._M_dataplus._M_p = (pointer)&(this->client_signature).field_2;
  pcVar1 = (client_signature->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->client_signature,pcVar1,pcVar1 + client_signature->_M_string_length);
  this->has_client_sig = client_signature->_M_string_length != 0;
  (this->extra_data)._M_dataplus._M_p = (pointer)&(this->extra_data).field_2;
  pcVar1 = (extra_data->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->extra_data,pcVar1,pcVar1 + extra_data->_M_string_length);
  return;
}

Assistant:

FullLicenseInfo::FullLicenseInfo(const string& source, const string& product,
		const string& license_signature, int licenseVersion, string from_date,
		string to_date, const string& client_signature,
		unsigned int from_sw_version, unsigned int to_sw_version,
		const string& extra_data) :
		source(source), product(product), //
		license_signature(license_signature), license_version(licenseVersion), //
		from_date(from_date), to_date(to_date), //
		has_expiry(to_date != UNUSED_TIME), //
		from_sw_version(from_sw_version), to_sw_version(to_sw_version), //
		has_versions(
				from_sw_version != UNUSED_SOFTWARE_VERSION
						|| to_sw_version != UNUSED_SOFTWARE_VERSION), //
		client_signature(client_signature), has_client_sig(
				client_signature.length() > 0), //
		extra_data(extra_data) {
}